

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::averageDownCoeffsSameAmrLevel(MLNodeLaplacian *this,int amrlev)

{
  undefined8 uVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  IntVect *pIVar5;
  long in_RDI;
  int i_3;
  int j_3;
  int k_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  Array4<const_double> *ffab_1;
  Array4<double> *cfab_1;
  Box *bx_1;
  MFIter mfi_1;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *ffab;
  Array4<double> *cfab;
  Box *bx;
  MFIter mfi;
  MultiFab *pcrse;
  BoxArray *ba;
  MultiFab cfine;
  bool need_parallel_copy;
  MultiFab *crse;
  MultiFab *fine;
  int idim;
  IntVect ratio;
  bool regular_coarsening;
  int idir;
  int mglev;
  int nsigma;
  Real cr;
  Real cl;
  Real cr_1;
  Real cl_1;
  Real cr_2;
  Real cl_2;
  Real cr_5;
  Real cl_5;
  Real cr_4;
  Real cl_4;
  Real cr_3;
  Real cl_3;
  BoxArray *in_stack_fffffffffffff1c8;
  BoxArray *in_stack_fffffffffffff1d0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff1d8;
  FabArrayBase *in_stack_fffffffffffff1e0;
  BoxArray *in_stack_fffffffffffff1e8;
  MFIter *in_stack_fffffffffffff1f0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff1f8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff200;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff208;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  MFIter *in_stack_fffffffffffff230;
  bool local_db9;
  byte local_db1;
  int local_da4;
  int local_da0;
  BATType local_d9c;
  undefined1 local_d58 [176];
  FabArrayBase *local_ca8;
  MFIter local_ca0;
  int local_c3c;
  int local_c38;
  int local_c34;
  MultiArray4<double> local_c30;
  int local_c28;
  Array4<double> *local_c1c;
  int local_c14;
  pointer local_c10;
  int local_c08;
  pointer local_c00;
  int local_bf8;
  int local_bf4;
  int local_bf0;
  int local_bec;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_be8;
  int local_be0;
  PCData<amrex::FArrayBox> *local_bd4;
  int local_bcc;
  undefined8 local_bc8;
  int local_bc0;
  undefined8 local_bb8;
  int local_bb0;
  int local_bac;
  int local_ba8;
  int local_ba4;
  undefined8 local_ba0;
  int local_b98;
  undefined8 local_b8c;
  int local_b84;
  undefined8 local_b80;
  int local_b78;
  undefined8 local_b70;
  int local_b68;
  long local_b60;
  long local_b58;
  long local_b50;
  int local_b40;
  int local_b3c;
  int local_b38;
  long *local_b20;
  long local_b18 [8];
  long *local_ad8;
  int local_acc [7];
  int *local_ab0;
  MFIter local_aa8;
  FabArray<amrex::FArrayBox> *local_a48;
  undefined1 local_a40 [72];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_9f8 [6];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_990;
  FabArray<amrex::FArrayBox> local_988;
  byte local_801;
  FabArray<amrex::FArrayBox> *local_800;
  FabArrayBase *local_7f8;
  int local_7ec;
  undefined8 local_7e8;
  int local_7e0;
  bool local_7d9;
  int local_7d8;
  int local_7d4;
  int local_7d0;
  undefined4 local_7bc;
  IntVect *local_7b8;
  undefined4 local_7ac;
  undefined8 *local_7a8;
  undefined4 local_79c;
  undefined8 *local_798;
  _func_int **local_790;
  BATType local_788;
  FabArrayBase *local_780;
  int local_774;
  int iStack_770;
  BATType local_76c;
  pointer local_768;
  int local_760;
  int *local_758;
  int local_74c;
  int iStack_748;
  int local_744;
  undefined8 local_740;
  int local_738;
  int *local_730;
  int local_724;
  int iStack_720;
  int local_71c;
  undefined8 local_718;
  int local_710;
  int *local_708;
  int local_6fc;
  int iStack_6f8;
  int local_6f4;
  undefined8 local_6f0;
  int local_6e8;
  FabArrayBase *local_6e0;
  uint local_6d4;
  uint uStack_6d0;
  int local_6cc;
  Array4<double> *local_6c8;
  int local_6c0;
  int *local_6b8;
  int local_6ac;
  int iStack_6a8;
  int local_6a4;
  PCData<amrex::FArrayBox> *local_6a0;
  int local_698;
  int *local_690;
  int local_684;
  int iStack_680;
  int local_67c;
  undefined8 local_678;
  int local_670;
  int *local_668;
  int local_65c;
  int iStack_658;
  int local_654;
  double local_650;
  double local_648;
  long *local_640;
  long *local_638;
  int local_62c;
  int local_628;
  int local_624;
  double local_620;
  double local_618;
  long *local_610;
  long *local_608;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  double local_5f0;
  double local_5e8;
  long *local_5e0;
  long *local_5d8;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  int local_58c;
  FabArray<amrex::FArrayBox> *local_588;
  BoxArray *local_580;
  BATType local_578;
  int local_574;
  int local_570;
  undefined4 local_56c;
  int *local_568;
  undefined4 local_55c;
  int *local_558;
  undefined4 local_54c;
  int *local_548;
  undefined4 local_53c;
  int *local_538;
  undefined4 local_52c;
  int *local_528;
  undefined4 local_51c;
  int *local_518;
  undefined4 local_50c;
  int *local_508;
  undefined4 local_4fc;
  int *local_4f8;
  undefined4 local_4ec;
  int *local_4e8;
  undefined4 local_4dc;
  BATOp *local_4d8;
  undefined4 local_4cc;
  BATOp *local_4c8;
  undefined4 local_4bc;
  BATOp *local_4b8;
  undefined4 local_4ac;
  int *local_4a8;
  undefined4 local_49c;
  int *local_498;
  undefined4 local_48c;
  int *local_488;
  undefined4 local_47c;
  int *local_478;
  undefined4 local_46c;
  int *local_468;
  undefined4 local_45c;
  int *local_458;
  undefined4 local_44c;
  int *local_448;
  undefined4 local_43c;
  int *local_438;
  undefined4 local_42c;
  int *local_428;
  undefined4 local_41c;
  FabArrayBase *local_418;
  undefined4 local_40c;
  FabArrayBase *local_408;
  undefined4 local_3fc;
  FabArrayBase *local_3f8;
  BATType local_3ec;
  int local_3e8;
  int local_3e4;
  BoxArray *local_3e0;
  BATType local_3d4;
  int local_3d0;
  int local_3cc;
  BoxArray *local_3c8;
  BATType local_3bc;
  int local_3b8;
  int local_3b4;
  BoxArray *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  long *local_398;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  BATType local_35c;
  int local_358;
  int local_354;
  FabArray<amrex::FArrayBox> *local_350;
  BATType local_344;
  int local_340;
  int local_33c;
  FabArray<amrex::FArrayBox> *local_338;
  BATType local_32c;
  int local_328;
  int local_324;
  FabArray<amrex::FArrayBox> *local_320;
  BATType local_314;
  int local_310;
  int local_30c;
  FabArray<amrex::FArrayBox> *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  FabArray<amrex::FArrayBox> *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  FabArray<amrex::FArrayBox> *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  FabArray<amrex::FArrayBox> *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  FabArray<amrex::FArrayBox> *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  FabArray<amrex::FArrayBox> *local_290;
  int local_284;
  int local_280;
  int local_27c;
  FabArray<amrex::FArrayBox> *local_278;
  int local_26c;
  int local_268;
  int local_264;
  FabArray<amrex::FArrayBox> *local_260;
  int local_254;
  int local_250;
  int local_24c;
  FabArray<amrex::FArrayBox> *local_248;
  int local_23c;
  int local_238;
  int local_234;
  long *local_230;
  int local_224;
  int local_220;
  int local_21c;
  long *local_218;
  int local_20c;
  int local_208;
  int local_204;
  long *local_200;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  long *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  long *local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  long *local_1b8;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  long *local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  long *local_188;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  int local_164;
  int local_160;
  int local_15c;
  long *local_158;
  int local_14c;
  int local_148;
  int local_144;
  long *local_140;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  int local_11c;
  int local_118;
  int local_114;
  long *local_110;
  int local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  long *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  int local_5c;
  int local_58;
  int local_54;
  long *local_50;
  int local_44;
  int local_40;
  int local_3c;
  long *local_38;
  int local_2c;
  int local_28;
  int local_24;
  long *local_20;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                *)in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
  Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                *)in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
  std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
  operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *)
             in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
  bVar3 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  if ((!bVar3) && (*(int *)(in_RDI + 0x560) == 0)) {
    local_db1 = 1;
    if ((*(byte *)(in_RDI + 0x641) & 1) == 0) {
      local_db1 = *(byte *)(in_RDI + 0x642);
    }
    local_7d0 = 1;
    if ((local_db1 & 1) != 0) {
      local_7d0 = 3;
    }
    for (local_7d4 = 1; iVar2 = local_7d4,
        piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1d0,
                            (size_type)in_stack_fffffffffffff1c8), iVar2 < *piVar4;
        local_7d4 = local_7d4 + 1) {
      local_7d8 = 2;
      local_7b8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
      local_7bc = 2;
      local_db9 = false;
      if ((local_7b8->vect[0] == 2) && (local_db9 = false, local_7b8->vect[1] == 2)) {
        local_db9 = local_7b8->vect[2] == 2;
      }
      local_7d9 = local_db9;
      pIVar5 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
      uVar1 = *(undefined8 *)pIVar5->vect;
      local_7e0 = pIVar5->vect[2];
      local_798 = &local_7e8;
      local_79c = 1;
      local_7e8._4_4_ = (int)((ulong)uVar1 >> 0x20);
      if (local_7e8._4_4_ == 1) {
        local_7d8 = 1;
      }
      else {
        local_7a8 = &local_7e8;
        local_7ac = 0;
        local_7e8._0_4_ = (int)uVar1;
        if ((int)local_7e8 == 1) {
          local_7d8 = 0;
        }
      }
      local_7e8 = uVar1;
      for (local_7ec = 0; local_7ec < local_7d0; local_7ec = local_7ec + 1) {
        Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                      *)in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
        Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
        ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                      *)in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
        local_7f8 = (FabArrayBase *)
                    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::
                    operator*((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                              in_stack_fffffffffffff1d0);
        Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                      *)in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
        Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
        ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                      *)in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)in_stack_fffffffffffff1d0,(size_type)in_stack_fffffffffffff1c8);
        local_800 = &std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::
                     operator*((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *
                               )in_stack_fffffffffffff1d0)->super_FabArray<amrex::FArrayBox>;
        bVar3 = isMFIterSafe(in_stack_fffffffffffff1e0,
                             &in_stack_fffffffffffff1d8->super_FabArrayBase);
        local_801 = (bVar3 ^ 0xffU) & 1;
        MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff1d0);
        this_00 = in_stack_fffffffffffff200;
        if ((local_801 & 1) != 0) {
          FabArrayBase::boxArray(local_7f8);
          amrex::coarsen(in_stack_fffffffffffff1e8,(IntVect *)in_stack_fffffffffffff1e0);
          this_01 = local_9f8;
          local_990 = this_01;
          FabArrayBase::DistributionMap(local_7f8);
          local_a40._24_8_ = 0;
          local_a40._32_8_ = 0;
          local_a40._8_8_ = 0;
          local_a40._16_8_ = 0;
          local_a40._40_8_ = 0;
          in_stack_fffffffffffff230 = (MFIter *)(local_a40 + 8);
          MFInfo::MFInfo((MFInfo *)0x171daf3);
          local_a40._0_8_ = 0;
          in_stack_fffffffffffff1c8 = (BoxArray *)local_a40;
          DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                    ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff1d0);
          MultiFab::define((MultiFab *)this_01,in_stack_fffffffffffff1c8,
                           (DistributionMapping *)in_stack_fffffffffffff210,
                           (int)((ulong)in_stack_fffffffffffff208 >> 0x20),
                           (int)in_stack_fffffffffffff208,(MFInfo *)in_stack_fffffffffffff200,
                           (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff230);
          DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                    ((DefaultFabFactory<amrex::FArrayBox> *)0x171db4f);
          MFInfo::~MFInfo((MFInfo *)0x171db5c);
          BoxArray::~BoxArray(in_stack_fffffffffffff1d0);
          this_00 = in_stack_fffffffffffff200;
        }
        in_stack_fffffffffffff200 = local_800;
        if ((local_801 & 1) != 0) {
          in_stack_fffffffffffff200 = &local_988;
        }
        in_stack_fffffffffffff210 = in_stack_fffffffffffff200;
        local_a48 = in_stack_fffffffffffff200;
        if ((local_7d9 & 1U) == 0) {
          TilingIfNotGPU();
          MFIter::MFIter((MFIter *)in_stack_fffffffffffff200,
                         &in_stack_fffffffffffff1f8->super_FabArrayBase,
                         SUB81((ulong)in_stack_fffffffffffff1f0 >> 0x38,0));
          while (bVar3 = MFIter::isValid(&local_ca0), bVar3) {
            in_stack_fffffffffffff1e0 = (FabArrayBase *)(local_d58 + 0x94);
            in_stack_fffffffffffff1f0 = &local_ca0;
            MFIter::tilebox(in_stack_fffffffffffff230);
            in_stack_fffffffffffff1e8 = (BoxArray *)(local_d58 + 0x48);
            local_ca8 = in_stack_fffffffffffff1e0;
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (in_stack_fffffffffffff1d8,(MFIter *)in_stack_fffffffffffff1d0);
            in_stack_fffffffffffff1f8 = (FabArray<amrex::FArrayBox> *)local_d58;
            local_d58._136_8_ = in_stack_fffffffffffff1e8;
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_fffffffffffff1d8,(MFIter *)in_stack_fffffffffffff1d0);
            local_780 = local_ca8;
            local_3f8 = local_ca8;
            local_3fc = 0;
            local_774 = *(int *)&local_ca8->_vptr_FabArrayBase;
            local_408 = local_ca8;
            local_40c = 1;
            iStack_770 = *(int *)((long)&local_ca8->_vptr_FabArrayBase + 4);
            local_790 = local_ca8->_vptr_FabArrayBase;
            local_418 = local_ca8;
            local_41c = 2;
            local_788 = (local_ca8->boxarray).m_bat.m_bat_type;
            local_6e0 = local_ca8;
            local_4b8 = &(local_ca8->boxarray).m_bat.m_op;
            local_4bc = 0;
            local_6d4 = (local_4b8->m_indexType).m_typ.itype;
            local_4c8 = &(local_ca8->boxarray).m_bat.m_op;
            local_4cc = 1;
            uStack_6d0 = (local_ca8->boxarray).m_bat.m_op.m_bndryReg.m_typ.itype;
            local_6f0 = *(undefined8 *)local_4b8;
            local_4d8 = &(local_ca8->boxarray).m_bat.m_op;
            local_4dc = 2;
            local_6e8 = (local_ca8->boxarray).m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
            for (local_d9c = local_788; local_da0 = iStack_770, (int)local_d9c <= local_6e8;
                local_d9c = local_d9c + indexType) {
              for (; local_da4 = local_774, local_da0 <= (int)uStack_6d0; local_da0 = local_da0 + 1)
              {
                for (; local_da4 <= (int)local_6d4; local_da4 = local_da4 + 1) {
                  local_570 = local_da4;
                  local_574 = local_da0;
                  local_578 = local_d9c;
                  local_580 = (BoxArray *)local_d58._136_8_;
                  local_58c = local_7d8;
                  if (local_7d8 == 2) {
                    local_30c = local_da4 * 2;
                    local_310 = local_da0 * 2;
                    local_314 = local_d9c;
                    local_324 = local_da4 * 2;
                    local_328 = local_da0 * 2 + 1;
                    local_32c = local_d9c;
                    local_598 = (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_30c -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_310 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(int)(local_d9c -
                                                    (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                    boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2])
                                         * *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                            super_FabArrayBase).boxarray.m_bat.m_op
                                                    + 4)] +
                                (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_324 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_328 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(int)(local_d9c -
                                                    (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                    boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2])
                                         * *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                            super_FabArrayBase).boxarray.m_bat.m_op
                                                    + 4)];
                    local_33c = local_da4 * 2 + 1;
                    local_340 = local_da0 * 2;
                    local_344 = local_d9c;
                    local_354 = local_da4 * 2 + 1;
                    local_358 = local_da0 * 2 + 1;
                    local_35c = local_d9c;
                    local_5a0 = (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_33c -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_340 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(int)(local_d9c -
                                                    (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                    boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2])
                                         * *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                            super_FabArrayBase).boxarray.m_bat.m_op
                                                    + 4)] +
                                (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_354 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_358 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(int)(local_d9c -
                                                    (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                    boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2])
                                         * *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                            super_FabArrayBase).boxarray.m_bat.m_op
                                                    + 4)];
                    local_3e0 = (BoxArray *)local_d58._136_8_;
                    local_3e4 = local_da4;
                    local_3e8 = local_da0;
                    local_3ec = local_d9c;
                    *(double *)
                     (*(long *)(BATransformer *)local_d58._136_8_ +
                     ((long)(local_da4 -
                            (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.m_loshft.vect[2]
                            ) + (long)(local_da0 -
                                      (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.
                                      m_hishft.vect[0]) *
                                *(long *)((long)&((BATransformer *)local_d58._136_8_)->m_op + 4) +
                     (long)(int)(local_d9c -
                                (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.m_hishft.
                                vect[1]) *
                     *(long *)((long)&((BATransformer *)local_d58._136_8_)->m_op + 0xc)) * 8) =
                         (local_598 * local_5a0) / (local_598 + local_5a0);
                    local_350 = in_stack_fffffffffffff1f8;
                    local_338 = in_stack_fffffffffffff1f8;
                    local_320 = in_stack_fffffffffffff1f8;
                    local_308 = in_stack_fffffffffffff1f8;
                  }
                  else if (local_7d8 == 1) {
                    local_2ac = local_da4 * 2;
                    local_2b4 = local_d9c * 2;
                    local_2b0 = local_da0;
                    local_2c4 = local_da4 * 2;
                    local_2cc = local_d9c * 2 + 1;
                    local_2c8 = local_da0;
                    local_5a8 = (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_2ac -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_da0 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(local_2b4 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                         *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                          super_FabArrayBase).boxarray.m_bat.m_op +
                                                  4)] +
                                (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_2c4 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_da0 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(local_2cc -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                         *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                          super_FabArrayBase).boxarray.m_bat.m_op +
                                                  4)];
                    local_2dc = local_da4 * 2 + 1;
                    local_2e4 = local_d9c * 2;
                    local_2e0 = local_da0;
                    local_2f4 = local_da4 * 2 + 1;
                    local_2fc = local_d9c * 2 + 1;
                    local_2f8 = local_da0;
                    local_5b0 = (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_2dc -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_da0 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(local_2e4 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                         *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                          super_FabArrayBase).boxarray.m_bat.m_op +
                                                  4)] +
                                (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_2f4 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_da0 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(local_2fc -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                         *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                          super_FabArrayBase).boxarray.m_bat.m_op +
                                                  4)];
                    local_3c8 = (BoxArray *)local_d58._136_8_;
                    local_3cc = local_da4;
                    local_3d0 = local_da0;
                    local_3d4 = local_d9c;
                    *(double *)
                     (*(long *)(BATransformer *)local_d58._136_8_ +
                     ((long)(local_da4 -
                            (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.m_loshft.vect[2]
                            ) + (long)(local_da0 -
                                      (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.
                                      m_hishft.vect[0]) *
                                *(long *)((long)&((BATransformer *)local_d58._136_8_)->m_op + 4) +
                     (long)(int)(local_d9c -
                                (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.m_hishft.
                                vect[1]) *
                     *(long *)((long)&((BATransformer *)local_d58._136_8_)->m_op + 0xc)) * 8) =
                         (local_5a8 * local_5b0) / (local_5a8 + local_5b0);
                    local_2f0 = in_stack_fffffffffffff1f8;
                    local_2d8 = in_stack_fffffffffffff1f8;
                    local_2c0 = in_stack_fffffffffffff1f8;
                    local_2a8 = in_stack_fffffffffffff1f8;
                  }
                  else {
                    local_250 = local_da0 * 2;
                    local_254 = local_d9c * 2;
                    local_24c = local_da4;
                    local_268 = local_da0 * 2;
                    local_26c = local_d9c * 2 + 1;
                    local_264 = local_da4;
                    local_5b8 = (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_da4 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_250 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(local_254 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                         *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                          super_FabArrayBase).boxarray.m_bat.m_op +
                                                  4)] +
                                (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_da4 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_268 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(local_26c -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                         *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                          super_FabArrayBase).boxarray.m_bat.m_op +
                                                  4)];
                    local_280 = local_da0 * 2 + 1;
                    local_284 = local_d9c * 2;
                    local_27c = local_da4;
                    local_298 = local_da0 * 2 + 1;
                    local_29c = local_d9c * 2 + 1;
                    local_294 = local_da4;
                    local_5c0 = (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_da4 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_280 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(local_284 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                         *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                          super_FabArrayBase).boxarray.m_bat.m_op +
                                                  4)] +
                                (double)(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                        _vptr_FabArrayBase
                                        [(long)(local_da4 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) +
                                         (long)(local_298 -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                                         *(long *)&(in_stack_fffffffffffff1f8->super_FabArrayBase).
                                                   boxarray.m_bat +
                                         (long)(local_29c -
                                               (in_stack_fffffffffffff1f8->super_FabArrayBase).
                                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                                         *(long *)((long)&(in_stack_fffffffffffff1f8->
                                                          super_FabArrayBase).boxarray.m_bat.m_op +
                                                  4)];
                    local_3b0 = (BoxArray *)local_d58._136_8_;
                    local_3b4 = local_da4;
                    local_3b8 = local_da0;
                    local_3bc = local_d9c;
                    *(double *)
                     (*(long *)(BATransformer *)local_d58._136_8_ +
                     ((long)(local_da4 -
                            (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.m_loshft.vect[2]
                            ) + (long)(local_da0 -
                                      (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.
                                      m_hishft.vect[0]) *
                                *(long *)((long)&((BATransformer *)local_d58._136_8_)->m_op + 4) +
                     (long)(int)(local_d9c -
                                (((BATransformer *)local_d58._136_8_)->m_op).m_bndryReg.m_hishft.
                                vect[1]) *
                     *(long *)((long)&((BATransformer *)local_d58._136_8_)->m_op + 0xc)) * 8) =
                         (local_5b8 * local_5c0) / (local_5b8 + local_5c0);
                    local_290 = in_stack_fffffffffffff1f8;
                    local_278 = in_stack_fffffffffffff1f8;
                    local_260 = in_stack_fffffffffffff1f8;
                    local_248 = in_stack_fffffffffffff1f8;
                  }
                  local_588 = in_stack_fffffffffffff1f8;
                }
              }
            }
            local_d58._64_8_ = in_stack_fffffffffffff1f8;
            local_76c = local_788;
            local_6cc = local_6e8;
            MFIter::operator++(&local_ca0);
          }
          MFIter::~MFIter((MFIter *)in_stack_fffffffffffff1d0);
        }
        else {
          TilingIfNotGPU();
          MFIter::MFIter((MFIter *)this_00,&in_stack_fffffffffffff1f8->super_FabArrayBase,
                         SUB81((ulong)in_stack_fffffffffffff1f0 >> 0x38,0));
          in_stack_fffffffffffff208 = in_stack_fffffffffffff200;
          while (bVar3 = MFIter::isValid(&local_aa8), bVar3) {
            MFIter::tilebox(in_stack_fffffffffffff230);
            local_ab0 = local_acc;
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (in_stack_fffffffffffff1d8,(MFIter *)in_stack_fffffffffffff1d0);
            local_ad8 = local_b18;
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_fffffffffffff1d8,(MFIter *)in_stack_fffffffffffff1d0);
            local_b20 = &local_b60;
            if (local_7ec == 0) {
              local_708 = local_ab0;
              local_488 = local_ab0;
              local_48c = 0;
              local_6fc = *local_ab0;
              local_498 = local_ab0;
              local_49c = 1;
              iStack_6f8 = local_ab0[1];
              local_b80 = *(undefined8 *)local_ab0;
              local_4a8 = local_ab0;
              local_4ac = 2;
              local_b78 = local_ab0[2];
              local_668 = local_ab0;
              local_548 = local_ab0 + 3;
              local_54c = 0;
              local_65c = *local_548;
              local_558 = local_ab0 + 3;
              local_55c = 1;
              iStack_658 = local_ab0[4];
              local_ba0 = *(undefined8 *)local_548;
              local_568 = local_ab0 + 3;
              local_56c = 2;
              local_b98 = local_ab0[5];
              for (local_ba4 = local_b78; iVar2 = iStack_6f8, local_b8c = local_ba0,
                  local_b84 = local_b98, local_b70 = local_b80, local_b68 = local_b78,
                  local_718 = local_b80, local_710 = local_b78, local_6f4 = local_b78,
                  local_678 = local_ba0, local_670 = local_b98, local_654 = local_b98,
                  local_ba4 <= local_b98; local_ba4 = local_ba4 + 1) {
                while (local_ba8 = iVar2, iVar2 = local_6fc, local_ba8 <= iStack_658) {
                  while (local_bac = iVar2, local_bac <= local_65c) {
                    local_624 = local_bac;
                    local_628 = local_ba8;
                    local_62c = local_ba4;
                    local_638 = local_ad8;
                    local_c = local_bac * 2;
                    local_10 = local_ba8 * 2;
                    local_14 = local_ba4 * 2;
                    local_24 = local_bac * 2;
                    local_28 = local_ba8 * 2 + 1;
                    local_2c = local_ba4 * 2;
                    local_3c = local_bac * 2;
                    local_40 = local_ba8 * 2;
                    local_44 = local_ba4 * 2 + 1;
                    local_54 = local_bac * 2;
                    local_58 = local_ba8 * 2 + 1;
                    local_5c = local_ba4 * 2 + 1;
                    local_648 = *(double *)
                                 (local_b60 +
                                 ((long)(local_c - local_b40) + (local_10 - local_b3c) * local_b58 +
                                 (local_14 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_24 - local_b40) + (local_28 - local_b3c) * local_b58
                                 + (local_2c - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_3c - local_b40) + (local_40 - local_b3c) * local_b58
                                 + (local_44 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_54 - local_b40) + (local_58 - local_b3c) * local_b58
                                 + (local_5c - local_b38) * local_b50) * 8);
                    local_6c = local_bac * 2 + 1;
                    local_70 = local_ba8 * 2;
                    local_74 = local_ba4 * 2;
                    local_84 = local_bac * 2 + 1;
                    local_88 = local_ba8 * 2 + 1;
                    local_8c = local_ba4 * 2;
                    local_9c = local_bac * 2 + 1;
                    local_a0 = local_ba8 * 2;
                    local_a4 = local_ba4 * 2 + 1;
                    local_b4 = local_bac * 2 + 1;
                    local_b8 = local_ba8 * 2 + 1;
                    local_bc = local_ba4 * 2 + 1;
                    local_650 = *(double *)
                                 (local_b60 +
                                 ((long)(local_6c - local_b40) + (local_70 - local_b3c) * local_b58
                                 + (local_74 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_84 - local_b40) + (local_88 - local_b3c) * local_b58
                                 + (local_8c - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_9c - local_b40) + (local_a0 - local_b3c) * local_b58
                                 + (local_a4 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_b4 - local_b40) + (local_b8 - local_b3c) * local_b58
                                 + (local_bc - local_b38) * local_b50) * 8);
                    local_368 = local_ad8;
                    local_36c = local_bac;
                    local_370 = local_ba8;
                    local_374 = local_ba4;
                    *(double *)
                     (*local_ad8 +
                     ((long)(local_bac - (int)local_ad8[4]) +
                      (long)(local_ba8 - *(int *)((long)local_ad8 + 0x24)) * local_ad8[1] +
                     (long)(local_ba4 - (int)local_ad8[5]) * local_ad8[2]) * 8) =
                         (local_648 * 0.5 * local_650) / (local_648 + local_650);
                    local_640 = local_b20;
                    local_b0 = local_b20;
                    local_98 = local_b20;
                    local_80 = local_b20;
                    local_68 = local_b20;
                    local_50 = local_b20;
                    local_38 = local_b20;
                    local_20 = local_b20;
                    local_8 = local_b20;
                    iVar2 = local_bac + 1;
                  }
                  iVar2 = local_ba8 + 1;
                }
              }
            }
            else if (local_7ec == 1) {
              local_730 = local_ab0;
              local_458 = local_ab0;
              local_45c = 0;
              local_724 = *local_ab0;
              local_468 = local_ab0;
              local_46c = 1;
              iStack_720 = local_ab0[1];
              local_bc8 = *(undefined8 *)local_ab0;
              local_478 = local_ab0;
              local_47c = 2;
              local_bc0 = local_ab0[2];
              local_690 = local_ab0;
              local_518 = local_ab0 + 3;
              local_51c = 0;
              local_684 = *local_518;
              local_528 = local_ab0 + 3;
              local_52c = 1;
              iStack_680 = local_ab0[4];
              local_be8._M_t.
              super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
              .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
                   *(__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                     *)local_518;
              local_538 = local_ab0 + 3;
              local_53c = 2;
              local_be0 = local_ab0[5];
              for (local_bec = local_bc0; iVar2 = iStack_720,
                  local_bd4 = (PCData<amrex::FArrayBox> *)
                              local_be8._M_t.
                              super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                              .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>.
                              _M_head_impl, local_bcc = local_be0, local_bb8 = local_bc8,
                  local_bb0 = local_bc0, local_740 = local_bc8, local_738 = local_bc0,
                  local_71c = local_bc0,
                  local_6a0 = (PCData<amrex::FArrayBox> *)
                              local_be8._M_t.
                              super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                              .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>.
                              _M_head_impl, local_698 = local_be0, local_67c = local_be0,
                  local_bec <= local_be0; local_bec = local_bec + 1) {
                while (local_bf0 = iVar2, iVar2 = local_724, local_bf0 <= iStack_680) {
                  while (local_bf4 = iVar2, local_bf4 <= local_684) {
                    local_5f4 = local_bf4;
                    local_5f8 = local_bf0;
                    local_5fc = local_bec;
                    local_608 = local_ad8;
                    local_cc = local_bf4 * 2;
                    local_d0 = local_bf0 * 2;
                    local_d4 = local_bec * 2;
                    local_e4 = local_bf4 * 2 + 1;
                    local_e8 = local_bf0 * 2;
                    local_ec = local_bec * 2;
                    local_fc = local_bf4 * 2;
                    local_100 = local_bf0 * 2;
                    local_104 = local_bec * 2 + 1;
                    local_114 = local_bf4 * 2 + 1;
                    local_118 = local_bf0 * 2;
                    local_11c = local_bec * 2 + 1;
                    local_618 = *(double *)
                                 (local_b60 +
                                 ((long)(local_cc - local_b40) + (local_d0 - local_b3c) * local_b58
                                 + (local_d4 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_e4 - local_b40) + (local_e8 - local_b3c) * local_b58
                                 + (local_ec - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_fc - local_b40) + (local_100 - local_b3c) * local_b58
                                 + (local_104 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_114 - local_b40) +
                                  (local_118 - local_b3c) * local_b58 +
                                 (local_11c - local_b38) * local_b50) * 8);
                    local_12c = local_bf4 * 2;
                    local_130 = local_bf0 * 2 + 1;
                    local_134 = local_bec * 2;
                    local_144 = local_bf4 * 2 + 1;
                    local_148 = local_bf0 * 2 + 1;
                    local_14c = local_bec * 2;
                    local_15c = local_bf4 * 2;
                    local_160 = local_bf0 * 2 + 1;
                    local_164 = local_bec * 2 + 1;
                    local_174 = local_bf4 * 2 + 1;
                    local_178 = local_bf0 * 2 + 1;
                    local_17c = local_bec * 2 + 1;
                    local_620 = *(double *)
                                 (local_b60 +
                                 ((long)(local_12c - local_b40) +
                                  (local_130 - local_b3c) * local_b58 +
                                 (local_134 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_144 - local_b40) +
                                  (local_148 - local_b3c) * local_b58 +
                                 (local_14c - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_15c - local_b40) +
                                  (local_160 - local_b3c) * local_b58 +
                                 (local_164 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_174 - local_b40) +
                                  (local_178 - local_b3c) * local_b58 +
                                 (local_17c - local_b38) * local_b50) * 8);
                    local_380 = local_ad8;
                    local_384 = local_bf4;
                    local_388 = local_bf0;
                    local_38c = local_bec;
                    *(double *)
                     (*local_ad8 +
                     ((long)(local_bf4 - (int)local_ad8[4]) +
                      (long)(local_bf0 - *(int *)((long)local_ad8 + 0x24)) * local_ad8[1] +
                     (long)(local_bec - (int)local_ad8[5]) * local_ad8[2]) * 8) =
                         (local_618 * 0.5 * local_620) / (local_618 + local_620);
                    local_610 = local_b20;
                    local_170 = local_b20;
                    local_158 = local_b20;
                    local_140 = local_b20;
                    local_128 = local_b20;
                    local_110 = local_b20;
                    local_f8 = local_b20;
                    local_e0 = local_b20;
                    local_c8 = local_b20;
                    iVar2 = local_bf4 + 1;
                  }
                  iVar2 = local_bf0 + 1;
                }
              }
            }
            else {
              local_758 = local_ab0;
              local_428 = local_ab0;
              local_42c = 0;
              local_74c = *local_ab0;
              local_438 = local_ab0;
              local_43c = 1;
              iStack_748 = local_ab0[1];
              local_c10 = *(pointer *)local_ab0;
              local_448 = local_ab0;
              local_44c = 2;
              local_c08 = local_ab0[2];
              local_6b8 = local_ab0;
              local_4e8 = local_ab0 + 3;
              local_4ec = 0;
              local_6ac = *local_4e8;
              local_4f8 = local_ab0 + 3;
              local_4fc = 1;
              iStack_6a8 = local_ab0[4];
              local_c30.hp = *(Array4<double> **)local_4e8;
              local_508 = local_ab0 + 3;
              local_50c = 2;
              local_c28 = local_ab0[5];
              for (local_c34 = local_c08; iVar2 = iStack_748, local_c1c = local_c30.hp,
                  local_c14 = local_c28, local_c00 = local_c10, local_bf8 = local_c08,
                  local_768 = local_c10, local_760 = local_c08, local_744 = local_c08,
                  local_6c8 = local_c30.hp, local_6c0 = local_c28, local_6a4 = local_c28,
                  local_c34 <= local_c28; local_c34 = local_c34 + 1) {
                while (local_c38 = iVar2, iVar2 = local_74c, local_c38 <= iStack_6a8) {
                  while (local_c3c = iVar2, local_c3c <= local_6ac) {
                    local_5c4 = local_c3c;
                    local_5c8 = local_c38;
                    local_5cc = local_c34;
                    local_5d8 = local_ad8;
                    local_18c = local_c3c * 2;
                    local_190 = local_c38 * 2;
                    local_194 = local_c34 * 2;
                    local_1a4 = local_c3c * 2 + 1;
                    local_1a8 = local_c38 * 2;
                    local_1ac = local_c34 * 2;
                    local_1bc = local_c3c * 2;
                    local_1c0 = local_c38 * 2 + 1;
                    local_1c4 = local_c34 * 2;
                    local_1d4 = local_c3c * 2 + 1;
                    local_1d8 = local_c38 * 2 + 1;
                    local_1dc = local_c34 * 2;
                    local_5e8 = *(double *)
                                 (local_b60 +
                                 ((long)(local_18c - local_b40) +
                                  (local_190 - local_b3c) * local_b58 +
                                 (local_194 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_1a4 - local_b40) +
                                  (local_1a8 - local_b3c) * local_b58 +
                                 (local_1ac - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_1bc - local_b40) +
                                  (local_1c0 - local_b3c) * local_b58 +
                                 (local_1c4 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_1d4 - local_b40) +
                                  (local_1d8 - local_b3c) * local_b58 +
                                 (local_1dc - local_b38) * local_b50) * 8);
                    local_1ec = local_c3c * 2;
                    local_1f0 = local_c38 * 2;
                    local_1f4 = local_c34 * 2 + 1;
                    local_204 = local_c3c * 2 + 1;
                    local_208 = local_c38 * 2;
                    local_20c = local_c34 * 2 + 1;
                    local_21c = local_c3c * 2;
                    local_220 = local_c38 * 2 + 1;
                    local_224 = local_c34 * 2 + 1;
                    local_234 = local_c3c * 2 + 1;
                    local_238 = local_c38 * 2 + 1;
                    local_23c = local_c34 * 2 + 1;
                    local_5f0 = *(double *)
                                 (local_b60 +
                                 ((long)(local_1ec - local_b40) +
                                  (local_1f0 - local_b3c) * local_b58 +
                                 (local_1f4 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_204 - local_b40) +
                                  (local_208 - local_b3c) * local_b58 +
                                 (local_20c - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_21c - local_b40) +
                                  (local_220 - local_b3c) * local_b58 +
                                 (local_224 - local_b38) * local_b50) * 8) +
                                *(double *)
                                 (local_b60 +
                                 ((long)(local_234 - local_b40) +
                                  (local_238 - local_b3c) * local_b58 +
                                 (local_23c - local_b38) * local_b50) * 8);
                    local_398 = local_ad8;
                    local_39c = local_c3c;
                    local_3a0 = local_c38;
                    local_3a4 = local_c34;
                    *(double *)
                     (*local_ad8 +
                     ((long)(local_c3c - (int)local_ad8[4]) +
                      (long)(local_c38 - *(int *)((long)local_ad8 + 0x24)) * local_ad8[1] +
                     (long)(local_c34 - (int)local_ad8[5]) * local_ad8[2]) * 8) =
                         (local_5e8 * 0.5 * local_5f0) / (local_5e8 + local_5f0);
                    local_5e0 = local_b20;
                    local_230 = local_b20;
                    local_218 = local_b20;
                    local_200 = local_b20;
                    local_1e8 = local_b20;
                    local_1d0 = local_b20;
                    local_1b8 = local_b20;
                    local_1a0 = local_b20;
                    local_188 = local_b20;
                    iVar2 = local_c3c + 1;
                  }
                  iVar2 = local_c38 + 1;
                }
              }
            }
            MFIter::operator++(&local_aa8);
          }
          MFIter::~MFIter((MFIter *)in_stack_fffffffffffff1d0);
          in_stack_fffffffffffff200 = this_00;
        }
        if ((local_801 & 1) != 0) {
          in_stack_fffffffffffff1d8 = local_800;
          Periodicity::NonPeriodic();
          FabArray<amrex::FArrayBox>::ParallelCopy
                    (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                     (Periodicity *)in_stack_fffffffffffff1f0,
                     (CpOp)((ulong)in_stack_fffffffffffff1e8 >> 0x20));
        }
        MultiFab::~MultiFab((MultiFab *)0x17202b9);
      }
    }
  }
  return;
}

Assistant:

void
MLNodeLaplacian::averageDownCoeffsSameAmrLevel (int amrlev)
{
    if (m_sigma[0][0][0] == nullptr) return;

    if (m_coarsening_strategy != CoarseningStrategy::Sigma) return;

    const int nsigma = (m_use_harmonic_average || m_use_mapped) ? AMREX_SPACEDIM : 1;

    for (int mglev = 1; mglev < m_num_mg_levels[amrlev]; ++mglev)
    {
        int idir = 2;
        bool regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
        IntVect ratio = mg_coarsen_ratio_vec[mglev-1];
        if (ratio[1] == 1) {
            idir = 1;
        } else if (ratio[0] == 1) {
            idir = 0;
        }
        for (int idim = 0; idim < nsigma; ++idim)
        {
            const MultiFab& fine = *m_sigma[amrlev][mglev-1][idim];
            MultiFab& crse = *m_sigma[amrlev][mglev][idim];
            bool need_parallel_copy = !amrex::isMFIterSafe(crse, fine);
            MultiFab cfine;
            if (need_parallel_copy) {
                const BoxArray& ba = amrex::coarsen(fine.boxArray(), ratio);
                cfine.define(ba, fine.DistributionMap(), 1, 0);
            }

            MultiFab* pcrse = (need_parallel_copy) ? &cfine : &crse;

            if (regular_coarsening) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& cfab = pcrse->array(mfi);
                    Array4<Real const> const& ffab = fine.const_array(mfi);
                    if (idim == 0) {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
                        {
                            mlndlap_avgdown_coeff_x(i,j,k,cfab,ffab);
                        });
                    } else if (idim == 1) {
#if (AMREX_SPACEDIM >= 2)
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
                        {
                            mlndlap_avgdown_coeff_y(i,j,k,cfab,ffab);
                        });
#endif
                    } else {
#if (AMREX_SPACEDIM == 3)
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
                        {
                            mlndlap_avgdown_coeff_z(i,j,k,cfab,ffab);
                        });
#endif
                    }
                }
            } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& cfab = pcrse->array(mfi);
                    Array4<Real const> const& ffab = fine.const_array(mfi);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
                    {
                        mlndlap_semi_avgdown_coeff(i,j,k,cfab,ffab,idir);
                    });
                }
            }
            if (need_parallel_copy) {
                crse.ParallelCopy(cfine);
            }
        }
    }
}